

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O0

If_Obj_t *
Lpk_MapTree_rec(Lpk_Man_t *p,Kit_DsdNtk_t *pNtk,If_Obj_t **ppLeaves,int iLit,If_Obj_t *pResult)

{
  If_Man_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Kit_DsdObj_t *pObj_00;
  If_Obj_t *pIVar5;
  If_Obj_t *pFan1;
  uint *puVar6;
  If_Obj_t *local_138;
  If_Obj_t *local_128;
  int fCompl;
  uint iLitFanin;
  uint i;
  If_Obj_t *pFansNew [16];
  If_Obj_t *pObjNew2;
  If_Obj_t *pObjNew;
  Kit_DsdObj_t *pObj;
  If_Obj_t *pResult_local;
  int iLit_local;
  If_Obj_t **ppLeaves_local;
  Kit_DsdNtk_t *pNtk_local;
  Lpk_Man_t *p_local;
  
  if (iLit < 0) {
    __assert_fail("iLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                  ,0x74,
                  "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                 );
  }
  iVar1 = Abc_Lit2Var(iLit);
  pObj_00 = Kit_DsdNtkObj(pNtk,iVar1);
  if (pObj_00 == (Kit_DsdObj_t *)0x0) {
    iVar1 = Abc_Lit2Var(iLit);
    pIVar5 = ppLeaves[iVar1];
    iVar1 = Abc_LitIsCompl(iLit);
    p_local = (Lpk_Man_t *)If_NotCond(pIVar5,iVar1);
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 1) {
    pIVar5 = If_ManConst1(p->pIfMan);
    iVar1 = Abc_LitIsCompl(iLit);
    p_local = (Lpk_Man_t *)If_NotCond(pIVar5,iVar1);
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 2) {
    iVar1 = Abc_Lit2Var((uint)*(ushort *)(pObj_00 + 1));
    pIVar5 = ppLeaves[iVar1];
    uVar2 = Abc_LitIsCompl(iLit);
    uVar3 = Abc_LitIsCompl((uint)*(ushort *)(pObj_00 + 1));
    p_local = (Lpk_Man_t *)If_NotCond(pIVar5,uVar2 ^ uVar3);
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 3) {
    if ((uint)*pObj_00 >> 0x1a != 2) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x88,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    _iLitFanin = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pObj_00 + 1),(If_Obj_t *)0x0);
    local_128 = pResult;
    if (pResult == (If_Obj_t *)0x0) {
      local_128 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pObj_00[1].field_0x2,
                                  (If_Obj_t *)0x0);
    }
    pFansNew[0] = local_128;
    if ((_iLitFanin == (If_Obj_t *)0x0) || (local_128 == (If_Obj_t *)0x0)) {
      p_local = (Lpk_Man_t *)0x0;
    }
    else {
      pIVar5 = If_ManCreateAnd(p->pIfMan,_iLitFanin,local_128);
      iVar1 = Abc_LitIsCompl(iLit);
      p_local = (Lpk_Man_t *)If_NotCond(pIVar5,iVar1);
    }
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 4) {
    uVar2 = Abc_LitIsCompl(iLit);
    if ((uint)*pObj_00 >> 0x1a != 2) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x93,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    _iLitFanin = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pObj_00 + 1),(If_Obj_t *)0x0);
    local_138 = pResult;
    if (pResult == (If_Obj_t *)0x0) {
      local_138 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pObj_00[1].field_0x2,
                                  (If_Obj_t *)0x0);
    }
    pFansNew[0] = local_138;
    if ((_iLitFanin == (If_Obj_t *)0x0) || (local_138 == (If_Obj_t *)0x0)) {
      p_local = (Lpk_Man_t *)0x0;
    }
    else {
      uVar3 = If_IsComplement(_iLitFanin);
      uVar4 = If_IsComplement(pFansNew[0]);
      p_00 = p->pIfMan;
      pIVar5 = If_Regular(_iLitFanin);
      pFan1 = If_Regular(pFansNew[0]);
      pIVar5 = If_ManCreateXor(p_00,pIVar5,pFan1);
      p_local = (Lpk_Man_t *)If_NotCond(pIVar5,uVar3 ^ uVar4 ^ uVar2);
    }
  }
  else {
    if (((uint)*pObj_00 >> 6 & 7) != 5) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x9c,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    p->nBlocks[(uint)*pObj_00 >> 0x1a] = p->nBlocks[(uint)*pObj_00 >> 0x1a] + 1;
    for (fCompl = 0; (uint)fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
      if (fCompl == 0) {
        if (pResult == (If_Obj_t *)0x0) {
          Lpk_MapTree_rec(p,pNtk,ppLeaves,
                          (uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)(uint)fCompl * 2),
                          (If_Obj_t *)0x0);
        }
      }
      else {
        pIVar5 = Lpk_MapTree_rec(p,pNtk,ppLeaves,
                                 (uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)(uint)fCompl * 2),
                                 (If_Obj_t *)0x0);
        *(If_Obj_t **)(&iLitFanin + (ulong)(uint)fCompl * 2) = pIVar5;
      }
      if (*(long *)(&iLitFanin + (ulong)(uint)fCompl * 2) == 0) {
        return (If_Obj_t *)0x0;
      }
    }
    if ((0 < p->pPars->nVarsShared) && (p->pPars->nLutSize < (int)((uint)*pObj_00 >> 0x1a))) {
      puVar6 = Kit_DsdObjTruth(pObj_00);
      pIVar5 = Lpk_MapSuppRedDec_rec(p,puVar6,(uint)*pObj_00 >> 0x1a,(If_Obj_t **)&iLitFanin);
      if (pIVar5 != (If_Obj_t *)0x0) {
        iVar1 = Abc_LitIsCompl(iLit);
        pIVar5 = If_NotCond(pIVar5,iVar1);
        return pIVar5;
      }
    }
    puVar6 = Kit_DsdObjTruth(pObj_00);
    pIVar5 = Lpk_MapPrime(p,puVar6,(uint)*pObj_00 >> 0x1a,(If_Obj_t **)&iLitFanin);
    iVar1 = Abc_LitIsCompl(iLit);
    p_local = (Lpk_Man_t *)If_NotCond(pIVar5,iVar1);
  }
  return (If_Obj_t *)p_local;
}

Assistant:

If_Obj_t * Lpk_MapTree_rec( Lpk_Man_t * p, Kit_DsdNtk_t * pNtk, If_Obj_t ** ppLeaves, int iLit, If_Obj_t * pResult )
{
    Kit_DsdObj_t * pObj;
    If_Obj_t * pObjNew = NULL, * pObjNew2 = NULL, * pFansNew[16];
    unsigned i, iLitFanin;

    assert( iLit >= 0 );

    // consider the case of a gate
    pObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(iLit)];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        return If_NotCond( If_ManConst1(p->pIfMan), Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_VAR )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(pObj->pFans[0])];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) ^ Abc_LitIsCompl(pObj->pFans[0]) );
    }
    if ( pObj->Type == KIT_DSD_AND )
    {
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        pObjNew = If_ManCreateAnd( p->pIfMan, pFansNew[0], pFansNew[1] ); 
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        int fCompl = Abc_LitIsCompl(iLit);
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        fCompl ^= If_IsComplement(pFansNew[0]) ^ If_IsComplement(pFansNew[1]);
        pObjNew = If_ManCreateXor( p->pIfMan, If_Regular(pFansNew[0]), If_Regular(pFansNew[1]) );
        return If_NotCond( pObjNew, fCompl );
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    p->nBlocks[pObj->nFans]++;

    // solve for the inputs
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        if ( i == 0 )
            pFansNew[i] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        else
            pFansNew[i] = Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        if ( pFansNew[i] == NULL )
            return NULL;
    }
/* 
    if ( !p->fCofactoring && p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew = Lpk_MapTreeMulti( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
*/
/*
    if ( (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapTreeMux_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
//        if ( pObjNew2 )
//            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }
*/

    // find best cofactoring variable
    if ( p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapSuppRedDec_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        if ( pObjNew2 )
            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }

    pObjNew = Lpk_MapPrime( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );

    // add choice
    if ( pObjNew && pObjNew2 )
    {
        If_ObjSetChoice( If_Regular(pObjNew), If_Regular(pObjNew2) );
        If_ManCreateChoice( p->pIfMan, If_Regular(pObjNew) );
    }
    return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
}